

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int luaK_exp2K(FuncState *fs,expdesc *e)

{
  bool bVar1;
  int iVar2;
  Value *v;
  TValue *io;
  TValue k;
  Value local_28;
  byte local_20;
  TValue local_18;
  
  if (e->t != e->f) goto LAB_0015bb00;
  v = &local_28;
  switch(e->k) {
  case VNIL:
    local_18.tt_ = '\0';
    local_28 = (Value)fs->ls->h;
    local_20 = 0x45;
    v = &local_18.value_;
    break;
  case VTRUE:
    local_20 = 0x11;
    break;
  case VFALSE:
    local_20 = 1;
    v = &local_28;
    break;
  case VK:
    iVar2 = (e->u).info;
    goto LAB_0015badb;
  case VKFLT:
    iVar2 = luaK_numberK(fs,(e->u).nval);
    goto LAB_0015badb;
  case VKINT:
    local_28 = *(Value *)&e->u;
    local_20 = 3;
    v = &local_28;
    break;
  case VKSTR:
    local_28 = (Value)(e->u).strval;
    local_20 = (local_28.gc)->tt | 0x40;
    v = &local_28;
    break;
  default:
    iVar2 = 0;
    goto LAB_0015baf0;
  }
  iVar2 = addk(fs,(TValue *)&local_28,(TValue *)v);
LAB_0015badb:
  if (iVar2 < 0x100) {
    e->k = VK;
    (e->u).info = iVar2;
    iVar2 = 1;
LAB_0015baf0:
    bVar1 = false;
  }
  else {
    bVar1 = true;
  }
  if (bVar1) {
LAB_0015bb00:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int luaK_exp2K (FuncState *fs, expdesc *e) {
  if (!hasjumps(e)) {
    int info;
    switch (e->k) {  /* move constants to 'k' */
      case VTRUE: info = boolT(fs); break;
      case VFALSE: info = boolF(fs); break;
      case VNIL: info = nilK(fs); break;
      case VKINT: info = luaK_intK(fs, e->u.ival); break;
      case VKFLT: info = luaK_numberK(fs, e->u.nval); break;
      case VKSTR: info = stringK(fs, e->u.strval); break;
      case VK: info = e->u.info; break;
      default: return 0;  /* not a constant */
    }
    if (info <= MAXINDEXRK) {  /* does constant fit in 'argC'? */
      e->k = VK;  /* make expression a 'K' expression */
      e->u.info = info;
      return 1;
    }
  }
  /* else, expression doesn't fit; leave it unchanged */
  return 0;
}